

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

void __thiscall CJSON::AddPair<unsigned_char>(CJSON *this,string *Name,uchar *val)

{
  byte bVar1;
  iterator iVar2;
  mapped_type *this_00;
  CJSONException *this_01;
  long *plVar3;
  size_type *psVar4;
  uint __len;
  string __str;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = *val;
    __len = 1;
    if (9 < bVar1) {
      __len = 3 - (bVar1 < 100);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_70._M_dataplus._M_p,__len,(uint)bVar1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->m_Values,Name);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_01 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::operator+(&local_50,"Name \'",Name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CJSONException::CJSONException(this_01,&local_70,NAME_ALREADY_EXITS);
  __cxa_throw(this_01,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline void AddPair(const std::string &Name, const T &val)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);

            m_Values[Name] = ValueToString(val); 
        }